

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
         *this,size_t i)

{
  float fVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined1 auVar20 [32];
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined4 uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined4 uVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  
  pBVar3 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.vertices.
           items;
  uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar4 = (pBVar3->super_RawBufferView).ptr_ofs;
  sVar5 = (pBVar3->super_RawBufferView).stride;
  auVar63 = *(undefined1 (*) [16])(pcVar4 + uVar2 * sVar5);
  lVar22 = (uVar2 + 1) * sVar5;
  auVar33 = *(undefined1 (*) [16])(pcVar4 + lVar22);
  lVar23 = (uVar2 + 2) * sVar5;
  auVar32 = *(undefined1 (*) [16])(pcVar4 + lVar23);
  lVar24 = (uVar2 + 3) * sVar5;
  auVar30 = *(undefined1 (*) [16])(pcVar4 + lVar24);
  fVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar16 = fVar1 * *(float *)(pcVar4 + uVar2 * sVar5 + 0xc);
  fVar17 = fVar1 * *(float *)(pcVar4 + lVar22 + 0xc);
  fVar18 = fVar1 * *(float *)(pcVar4 + lVar23 + 0xc);
  fVar1 = fVar1 * *(float *)(pcVar4 + lVar24 + 0xc);
  lVar22 = (long)(this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 tessellationRate;
  uVar70 = auVar33._0_4_;
  uVar58 = auVar63._0_4_;
  if (lVar22 == 4) {
    auVar31._4_4_ = fVar1;
    auVar31._0_4_ = fVar1;
    auVar31._8_4_ = fVar1;
    auVar31._12_4_ = fVar1;
    auVar14 = vblendps_avx(auVar30,auVar31,8);
    auVar66._4_4_ = fVar18;
    auVar66._0_4_ = fVar18;
    auVar66._8_4_ = fVar18;
    auVar66._12_4_ = fVar18;
    auVar15 = vblendps_avx(auVar32,auVar66,8);
    auVar65._4_4_ = fVar17;
    auVar65._0_4_ = fVar17;
    auVar65._8_4_ = fVar17;
    auVar65._12_4_ = fVar17;
    auVar62 = vblendps_avx(auVar33,auVar65,8);
    auVar72._4_4_ = uVar58;
    auVar72._0_4_ = uVar58;
    auVar72._8_4_ = uVar58;
    auVar72._12_4_ = uVar58;
    auVar59 = vshufps_avx(auVar63,auVar63,0x55);
    auVar63 = vshufps_avx(auVar63,auVar63,0xaa);
    auVar68._4_4_ = fVar16;
    auVar68._0_4_ = fVar16;
    auVar68._8_4_ = fVar16;
    auVar68._12_4_ = fVar16;
    auVar74._4_4_ = uVar70;
    auVar74._0_4_ = uVar70;
    auVar74._8_4_ = uVar70;
    auVar74._12_4_ = uVar70;
    auVar25 = vshufps_avx512vl(auVar33,auVar33,0x55);
    auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
    auVar26 = vbroadcastss_avx512vl(auVar32);
    auVar27 = vshufps_avx512vl(auVar32,auVar32,0x55);
    auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar28 = vbroadcastss_avx512vl(auVar30);
    auVar29 = vshufps_avx512vl(auVar30,auVar30,0x55);
    auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
    auVar28 = vmulps_avx512vl(auVar28,bspline_basis0._3740_16_);
    auVar29 = vmulps_avx512vl(auVar29,bspline_basis0._3740_16_);
    auVar30 = vmulps_avx512vl(auVar30,bspline_basis0._3740_16_);
    auVar31 = vmulps_avx512vl(auVar31,bspline_basis0._3740_16_);
    auVar26 = vfmadd231ps_avx512vl(auVar28,bspline_basis0._2584_16_,auVar26);
    auVar27 = vfmadd231ps_avx512vl(auVar29,bspline_basis0._2584_16_,auVar27);
    auVar32 = vfmadd231ps_avx512vl(auVar30,bspline_basis0._2584_16_,auVar32);
    auVar30 = vfmadd231ps_avx512vl(auVar31,bspline_basis0._2584_16_,auVar66);
    auVar26 = vfmadd231ps_avx512vl(auVar26,bspline_basis0._1428_16_,auVar74);
    auVar25 = vfmadd231ps_avx512vl(auVar27,bspline_basis0._1428_16_,auVar25);
    auVar33 = vfmadd231ps_fma(auVar32,bspline_basis0._1428_16_,auVar33);
    auVar32 = vfmadd231ps_fma(auVar30,bspline_basis0._1428_16_,auVar65);
    auVar26 = vfmadd231ps_avx512vl(auVar26,bspline_basis0._272_16_,auVar72);
    auVar27 = vfmadd231ps_avx512vl(auVar25,bspline_basis0._272_16_,auVar59);
    auVar59 = vfmadd231ps_fma(auVar33,bspline_basis0._272_16_,auVar63);
    auVar25 = vfmadd231ps_fma(auVar32,bspline_basis0._272_16_,auVar68);
    auVar28 = vshufps_avx512vl(auVar26,auVar26,0xb1);
    auVar33 = vminps_avx512vl(auVar28,auVar26);
    auVar63 = vshufpd_avx(auVar33,auVar33,1);
    auVar63 = vminps_avx(auVar63,auVar33);
    auVar29 = vshufps_avx512vl(auVar27,auVar27,0xb1);
    auVar32 = vminps_avx512vl(auVar29,auVar27);
    auVar33 = vshufpd_avx(auVar32,auVar32,1);
    auVar33 = vminps_avx(auVar33,auVar32);
    auVar63 = vinsertps_avx(auVar63,auVar33,0x1c);
    auVar30 = vshufps_avx(auVar59,auVar59,0xb1);
    auVar33 = vminps_avx(auVar30,auVar59);
    auVar32 = vshufpd_avx(auVar33,auVar33,1);
    auVar33 = vminps_avx(auVar32,auVar33);
    auVar63 = vinsertps_avx(auVar63,auVar33,0x20);
    auVar32 = vmaxps_avx512vl(auVar28,auVar26);
    auVar33 = vshufpd_avx(auVar32,auVar32,1);
    auVar33 = vmaxps_avx(auVar33,auVar32);
    auVar26 = vmaxps_avx512vl(auVar29,auVar27);
    auVar32 = vshufpd_avx(auVar26,auVar26,1);
    auVar32 = vmaxps_avx(auVar32,auVar26);
    auVar33 = vinsertps_avx(auVar33,auVar32,0x1c);
    auVar32 = vmaxps_avx(auVar30,auVar59);
    auVar30 = vshufpd_avx(auVar32,auVar32,1);
    auVar32 = vmaxps_avx(auVar30,auVar32);
    auVar33 = vinsertps_avx(auVar33,auVar32,0x20);
    auVar30._8_4_ = 0x7fffffff;
    auVar30._0_8_ = 0x7fffffff7fffffff;
    auVar30._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx512vl(auVar25,auVar30);
    auVar30 = vprolq_avx512vl(auVar32,0x20);
    auVar32 = vmaxps_avx(auVar30,auVar32);
    uVar58 = auVar32._0_4_;
    auVar25._4_4_ = uVar58;
    auVar25._0_4_ = uVar58;
    auVar25._8_4_ = uVar58;
    auVar25._12_4_ = uVar58;
    auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar32 = vmaxps_avx(auVar32,auVar25);
    auVar26._8_4_ = 0x3e2aaaab;
    auVar26._0_8_ = 0x3e2aaaab3e2aaaab;
    auVar26._12_4_ = 0x3e2aaaab;
    auVar59._0_4_ = auVar14._0_4_ * 0.16666667;
    auVar59._4_4_ = auVar14._4_4_ * 0.16666667;
    auVar59._8_4_ = auVar14._8_4_ * 0.16666667;
    auVar59._12_4_ = auVar14._12_4_ * 0.16666667;
    auVar14._8_4_ = 0x3f2aaaab;
    auVar14._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar14._12_4_ = 0x3f2aaaab;
    auVar30 = vfmadd231ps_avx512vl(auVar59,auVar15,auVar14);
    auVar30 = vfmadd231ps_fma(auVar30,auVar26,auVar62);
    auVar63 = vminps_avx(auVar63,auVar30);
    auVar33 = vmaxps_avx(auVar33,auVar30);
    auVar30 = vshufps_avx(auVar30,auVar30,0xff);
    auVar15._8_4_ = 0x7fffffff;
    auVar15._0_8_ = 0x7fffffff7fffffff;
    auVar15._12_4_ = 0x7fffffff;
    auVar30 = vandps_avx512vl(auVar30,auVar15);
    auVar32 = vmaxps_avx(auVar32,auVar30);
  }
  else {
    auVar34 = vpbroadcastd_avx512vl();
    auVar64._4_4_ = uVar58;
    auVar64._0_4_ = uVar58;
    auVar64._8_4_ = uVar58;
    auVar64._12_4_ = uVar58;
    auVar64._16_4_ = uVar58;
    auVar64._20_4_ = uVar58;
    auVar64._24_4_ = uVar58;
    auVar64._28_4_ = uVar58;
    auVar54._8_4_ = 1;
    auVar54._0_8_ = 0x100000001;
    auVar54._12_4_ = 1;
    auVar54._16_4_ = 1;
    auVar54._20_4_ = 1;
    auVar54._24_4_ = 1;
    auVar54._28_4_ = 1;
    auVar56 = vpermps_avx2(auVar54,ZEXT1632(auVar63));
    auVar35 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar36 = vpermps_avx512vl(auVar35,ZEXT1632(auVar63));
    auVar67._4_4_ = fVar16;
    auVar67._0_4_ = fVar16;
    auVar67._8_4_ = fVar16;
    auVar67._12_4_ = fVar16;
    auVar67._16_4_ = fVar16;
    auVar67._20_4_ = fVar16;
    auVar67._24_4_ = fVar16;
    auVar67._28_4_ = fVar16;
    auVar69._4_4_ = uVar70;
    auVar69._0_4_ = uVar70;
    auVar69._8_4_ = uVar70;
    auVar69._12_4_ = uVar70;
    auVar69._16_4_ = uVar70;
    auVar69._20_4_ = uVar70;
    auVar69._24_4_ = uVar70;
    auVar69._28_4_ = uVar70;
    auVar57 = vpermps_avx2(auVar54,ZEXT1632(auVar33));
    auVar37 = vpermps_avx512vl(auVar35,ZEXT1632(auVar33));
    auVar71._4_4_ = fVar17;
    auVar71._0_4_ = fVar17;
    auVar71._8_4_ = fVar17;
    auVar71._12_4_ = fVar17;
    auVar71._16_4_ = fVar17;
    auVar71._20_4_ = fVar17;
    auVar71._24_4_ = fVar17;
    auVar71._28_4_ = fVar17;
    uVar58 = auVar32._0_4_;
    auVar73._4_4_ = uVar58;
    auVar73._0_4_ = uVar58;
    auVar73._8_4_ = uVar58;
    auVar73._12_4_ = uVar58;
    auVar73._16_4_ = uVar58;
    auVar73._20_4_ = uVar58;
    auVar73._24_4_ = uVar58;
    auVar73._28_4_ = uVar58;
    auVar20 = vpermps_avx2(auVar54,ZEXT1632(auVar32));
    auVar38 = vpermps_avx512vl(auVar35,ZEXT1632(auVar32));
    auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)fVar18));
    auVar40 = vbroadcastss_avx512vl(auVar30);
    auVar41 = vpermps_avx512vl(auVar54,ZEXT1632(auVar30));
    auVar42 = vpermps_avx512vl(auVar35,ZEXT1632(auVar30));
    auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)fVar1));
    lVar23 = lVar22 * 0x44;
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar35._8_4_ = 0xff800000;
    auVar35._0_8_ = 0xff800000ff800000;
    auVar35._12_4_ = 0xff800000;
    auVar35._16_4_ = 0xff800000;
    auVar35._20_4_ = 0xff800000;
    auVar35._24_4_ = 0xff800000;
    auVar35._28_4_ = 0xff800000;
    auVar61 = ZEXT864(0);
    lVar24 = 0;
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar54 = auVar35;
    auVar55 = auVar35;
    auVar52 = auVar44;
    auVar53 = auVar44;
    for (; auVar60 = auVar61._0_32_, lVar24 <= lVar22; lVar24 = lVar24 + 8) {
      auVar46 = vpbroadcastd_avx512vl();
      auVar46 = vpord_avx512vl(auVar46,_DAT_01fb4ba0);
      uVar21 = vpcmpgtd_avx512vl(auVar46,auVar34);
      auVar46 = *(undefined1 (*) [32])(lVar23 + 0x2200430 + lVar24 * 4);
      auVar50 = *(undefined1 (*) [32])(lVar23 + 0x22008b4 + lVar24 * 4);
      auVar47 = vmulps_avx512vl(auVar40,auVar50);
      auVar48 = vmulps_avx512vl(auVar41,auVar50);
      auVar49 = vmulps_avx512vl(auVar42,auVar50);
      auVar50 = vmulps_avx512vl(auVar43,auVar50);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar46,auVar73);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar46,auVar20);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar46,auVar38);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar39,auVar46);
      auVar46 = *(undefined1 (*) [32])(lVar23 + 0x21fffac + lVar24 * 4);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar46,auVar69);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar46,auVar57);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar46,auVar37);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar71,auVar46);
      auVar46 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 * 4 + lVar23);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar46,auVar64);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar46,auVar56);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar46,auVar36);
      auVar46 = vfmadd231ps_avx512vl(auVar50,auVar67,auVar46);
      auVar50 = vminps_avx512vl(auVar52,auVar47);
      bVar6 = (byte)uVar21;
      auVar51._0_4_ = (uint)(bVar6 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar50._0_4_;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar51._4_4_ = (uint)bVar7 * auVar52._4_4_ | (uint)!bVar7 * auVar50._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar51._8_4_ = (uint)bVar7 * auVar52._8_4_ | (uint)!bVar7 * auVar50._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar51._12_4_ = (uint)bVar7 * auVar52._12_4_ | (uint)!bVar7 * auVar50._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar51._16_4_ = (uint)bVar7 * auVar52._16_4_ | (uint)!bVar7 * auVar50._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar51._20_4_ = (uint)bVar7 * auVar52._20_4_ | (uint)!bVar7 * auVar50._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar51._24_4_ = (uint)bVar7 * auVar52._24_4_ | (uint)!bVar7 * auVar50._24_4_;
      bVar7 = SUB81(uVar21 >> 7,0);
      auVar51._28_4_ = (uint)bVar7 * auVar52._28_4_ | (uint)!bVar7 * auVar50._28_4_;
      auVar52 = vminps_avx512vl(auVar53,auVar48);
      auVar50._0_4_ = (uint)(bVar6 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar52._0_4_;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar7 * auVar53._4_4_ | (uint)!bVar7 * auVar52._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar7 * auVar53._8_4_ | (uint)!bVar7 * auVar52._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar7 * auVar53._12_4_ | (uint)!bVar7 * auVar52._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar50._16_4_ = (uint)bVar7 * auVar53._16_4_ | (uint)!bVar7 * auVar52._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar50._20_4_ = (uint)bVar7 * auVar53._20_4_ | (uint)!bVar7 * auVar52._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar50._24_4_ = (uint)bVar7 * auVar53._24_4_ | (uint)!bVar7 * auVar52._24_4_;
      bVar7 = SUB81(uVar21 >> 7,0);
      auVar50._28_4_ = (uint)bVar7 * auVar53._28_4_ | (uint)!bVar7 * auVar52._28_4_;
      auVar53 = vminps_avx512vl(auVar44,auVar49);
      auVar52._0_4_ = (uint)(bVar6 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar53._0_4_;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar52._4_4_ = (uint)bVar7 * auVar44._4_4_ | (uint)!bVar7 * auVar53._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar52._8_4_ = (uint)bVar7 * auVar44._8_4_ | (uint)!bVar7 * auVar53._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar52._12_4_ = (uint)bVar7 * auVar44._12_4_ | (uint)!bVar7 * auVar53._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar52._16_4_ = (uint)bVar7 * auVar44._16_4_ | (uint)!bVar7 * auVar53._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar52._20_4_ = (uint)bVar7 * auVar44._20_4_ | (uint)!bVar7 * auVar53._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar52._24_4_ = (uint)bVar7 * auVar44._24_4_ | (uint)!bVar7 * auVar53._24_4_;
      bVar7 = SUB81(uVar21 >> 7,0);
      auVar52._28_4_ = (uint)bVar7 * auVar44._28_4_ | (uint)!bVar7 * auVar53._28_4_;
      auVar53 = vmaxps_avx512vl(auVar54,auVar47);
      auVar44._0_4_ = (uint)(bVar6 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar53._0_4_;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar44._4_4_ = (uint)bVar7 * auVar54._4_4_ | (uint)!bVar7 * auVar53._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar44._8_4_ = (uint)bVar7 * auVar54._8_4_ | (uint)!bVar7 * auVar53._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar44._12_4_ = (uint)bVar7 * auVar54._12_4_ | (uint)!bVar7 * auVar53._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar44._16_4_ = (uint)bVar7 * auVar54._16_4_ | (uint)!bVar7 * auVar53._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar44._20_4_ = (uint)bVar7 * auVar54._20_4_ | (uint)!bVar7 * auVar53._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar44._24_4_ = (uint)bVar7 * auVar54._24_4_ | (uint)!bVar7 * auVar53._24_4_;
      bVar7 = SUB81(uVar21 >> 7,0);
      auVar44._28_4_ = (uint)bVar7 * auVar54._28_4_ | (uint)!bVar7 * auVar53._28_4_;
      auVar54 = vmaxps_avx512vl(auVar55,auVar48);
      auVar53._0_4_ = (uint)(bVar6 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar54._0_4_;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar53._4_4_ = (uint)bVar7 * auVar55._4_4_ | (uint)!bVar7 * auVar54._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar53._8_4_ = (uint)bVar7 * auVar55._8_4_ | (uint)!bVar7 * auVar54._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar53._12_4_ = (uint)bVar7 * auVar55._12_4_ | (uint)!bVar7 * auVar54._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar53._16_4_ = (uint)bVar7 * auVar55._16_4_ | (uint)!bVar7 * auVar54._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar53._20_4_ = (uint)bVar7 * auVar55._20_4_ | (uint)!bVar7 * auVar54._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar53._24_4_ = (uint)bVar7 * auVar55._24_4_ | (uint)!bVar7 * auVar54._24_4_;
      bVar7 = SUB81(uVar21 >> 7,0);
      auVar53._28_4_ = (uint)bVar7 * auVar55._28_4_ | (uint)!bVar7 * auVar54._28_4_;
      auVar54 = vmaxps_avx512vl(auVar35,auVar49);
      auVar55._0_4_ = (uint)(bVar6 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar54._0_4_;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar55._4_4_ = (uint)bVar7 * auVar35._4_4_ | (uint)!bVar7 * auVar54._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar55._8_4_ = (uint)bVar7 * auVar35._8_4_ | (uint)!bVar7 * auVar54._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar55._12_4_ = (uint)bVar7 * auVar35._12_4_ | (uint)!bVar7 * auVar54._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar55._16_4_ = (uint)bVar7 * auVar35._16_4_ | (uint)!bVar7 * auVar54._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar55._20_4_ = (uint)bVar7 * auVar35._20_4_ | (uint)!bVar7 * auVar54._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar55._24_4_ = (uint)bVar7 * auVar35._24_4_ | (uint)!bVar7 * auVar54._24_4_;
      bVar7 = SUB81(uVar21 >> 7,0);
      auVar55._28_4_ = (uint)bVar7 * auVar35._28_4_ | (uint)!bVar7 * auVar54._28_4_;
      vandps_avx512vl(auVar46,auVar45);
      auVar35 = vmaxps_avx(auVar60,auVar55);
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar13 = SUB81(uVar21 >> 7,0);
      auVar61 = ZEXT3264(CONCAT428((uint)bVar13 * auVar61._28_4_ | (uint)!bVar13 * auVar35._28_4_,
                                   CONCAT424((uint)bVar12 * auVar61._24_4_ |
                                             (uint)!bVar12 * auVar35._24_4_,
                                             CONCAT420((uint)bVar11 * auVar61._20_4_ |
                                                       (uint)!bVar11 * auVar35._20_4_,
                                                       CONCAT416((uint)bVar10 * auVar61._16_4_ |
                                                                 (uint)!bVar10 * auVar35._16_4_,
                                                                 CONCAT412((uint)bVar9 *
                                                                           auVar61._12_4_ |
                                                                           (uint)!bVar9 *
                                                                           auVar35._12_4_,
                                                                           CONCAT48((uint)bVar8 *
                                                                                    auVar61._8_4_ |
                                                                                    (uint)!bVar8 *
                                                                                    auVar35._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar7 * auVar61._4_4_ |
                                                  (uint)!bVar7 * auVar35._4_4_,
                                                  (uint)(bVar6 & 1) * auVar61._0_4_ |
                                                  (uint)!(bool)(bVar6 & 1) * auVar35._0_4_))))))));
      auVar35 = auVar55;
      auVar54 = auVar44;
      auVar55 = auVar53;
      auVar44 = auVar52;
      auVar52 = auVar51;
      auVar53 = auVar50;
    }
    auVar56 = vshufps_avx512vl(auVar52,auVar52,0xb1);
    auVar57 = vminps_avx512vl(auVar52,auVar56);
    auVar56 = vshufpd_avx(auVar57,auVar57,5);
    auVar56 = vminps_avx(auVar57,auVar56);
    auVar63 = vminps_avx(auVar56._0_16_,auVar56._16_16_);
    auVar56 = vshufps_avx512vl(auVar53,auVar53,0xb1);
    auVar57 = vminps_avx512vl(auVar53,auVar56);
    auVar56 = vshufpd_avx(auVar57,auVar57,5);
    auVar56 = vminps_avx(auVar57,auVar56);
    auVar33 = vminps_avx(auVar56._0_16_,auVar56._16_16_);
    auVar33 = vunpcklps_avx(auVar63,auVar33);
    auVar56 = vshufps_avx512vl(auVar44,auVar44,0xb1);
    auVar57 = vminps_avx512vl(auVar44,auVar56);
    auVar56 = vshufpd_avx(auVar57,auVar57,5);
    auVar56 = vminps_avx(auVar57,auVar56);
    auVar63 = vminps_avx(auVar56._0_16_,auVar56._16_16_);
    auVar63 = vinsertps_avx(auVar33,auVar63,0x28);
    auVar56 = vshufps_avx(auVar54,auVar54,0xb1);
    auVar56 = vmaxps_avx(auVar54,auVar56);
    auVar57 = vshufpd_avx(auVar56,auVar56,5);
    auVar56 = vmaxps_avx(auVar56,auVar57);
    auVar33 = vmaxps_avx(auVar56._0_16_,auVar56._16_16_);
    auVar56 = vshufps_avx(auVar55,auVar55,0xb1);
    auVar56 = vmaxps_avx(auVar55,auVar56);
    auVar57 = vshufpd_avx(auVar56,auVar56,5);
    auVar56 = vmaxps_avx(auVar56,auVar57);
    auVar32 = vmaxps_avx(auVar56._0_16_,auVar56._16_16_);
    auVar32 = vunpcklps_avx(auVar33,auVar32);
    auVar56 = vshufps_avx(auVar35,auVar35,0xb1);
    auVar56 = vmaxps_avx(auVar35,auVar56);
    auVar57 = vshufpd_avx(auVar56,auVar56,5);
    auVar56 = vmaxps_avx(auVar56,auVar57);
    auVar33 = vmaxps_avx(auVar56._0_16_,auVar56._16_16_);
    auVar33 = vinsertps_avx(auVar32,auVar33,0x28);
    auVar56 = vshufps_avx(auVar60,auVar60,0xb1);
    auVar56 = vmaxps_avx(auVar60,auVar56);
    auVar57 = vshufpd_avx(auVar56,auVar56,5);
    auVar56 = vmaxps_avx(auVar56,auVar57);
    auVar32 = vmaxps_avx(auVar56._0_16_,auVar56._16_16_);
    uVar58 = auVar32._0_4_;
    auVar32._4_4_ = uVar58;
    auVar32._0_4_ = uVar58;
    auVar32._8_4_ = uVar58;
    auVar32._12_4_ = uVar58;
  }
  auVar30 = vsubps_avx(auVar63,auVar32);
  auVar62._0_4_ = auVar33._0_4_ + auVar32._0_4_;
  auVar62._4_4_ = auVar33._4_4_ + auVar32._4_4_;
  auVar62._8_4_ = auVar33._8_4_ + auVar32._8_4_;
  auVar62._12_4_ = auVar33._12_4_ + auVar32._12_4_;
  auVar33._8_4_ = 0x7fffffff;
  auVar33._0_8_ = 0x7fffffff7fffffff;
  auVar33._12_4_ = 0x7fffffff;
  auVar63 = vandps_avx(auVar30,auVar33);
  auVar33 = vandps_avx(auVar62,auVar33);
  auVar63 = vmaxps_avx(auVar63,auVar33);
  auVar33 = vmovshdup_avx(auVar63);
  auVar33 = vmaxss_avx(auVar33,auVar63);
  auVar63 = vshufpd_avx(auVar63,auVar63,1);
  auVar63 = vmaxss_avx(auVar63,auVar33);
  fVar1 = auVar63._0_4_ * 4.7683716e-07;
  auVar63._4_4_ = fVar1;
  auVar63._0_4_ = fVar1;
  auVar63._8_4_ = fVar1;
  auVar63._12_4_ = fVar1;
  aVar19 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar30,auVar63);
  (__return_storage_ptr__->lower).field_0 = aVar19;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar62._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar62._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar62._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar62._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }